

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O0

ofstream * ev3dev::anon_unknown_20::ofstream_open(string *path)

{
  ofstream *poVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 in_RDI;
  string *unaff_retaddr;
  ofstream *file;
  
  poVar1 = ofstream_cache(unaff_retaddr);
  uVar2 = std::ofstream::is_open();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::ofstream::rdbuf();
    std::streambuf::pubsetbuf(pcVar3,0);
    std::ofstream::open(poVar1,in_RDI,0x10);
  }
  else {
    std::ios::clear(poVar1 + *(long *)(*(long *)poVar1 + -0x18),0);
  }
  return poVar1;
}

Assistant:

std::ofstream &ofstream_open(const std::string &path) {
    std::ofstream &file = ofstream_cache(path);
    if (!file.is_open()) {
        // Don't buffer writes to avoid latency. Also saves a bit of memory.
        file.rdbuf()->pubsetbuf(NULL, 0);
        file.open(path);
    } else {
        // Clear the error bits in case something happened.
        file.clear();
    }
    return file;
}